

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
* common::FeeModeMap_abi_cxx11_(void)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>
  __l;
  int iVar1;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
  *in_stack_fffffffffffffef8;
  FeeEstimateMode *in_stack_ffffffffffffff20;
  char (*in_stack_ffffffffffffff28) [13];
  long *plVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
  *in_stack_ffffffffffffff30;
  long *plVar3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
  *in_stack_ffffffffffffff38;
  iterator ppVar4;
  size_type in_stack_ffffffffffffff48;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
  local_8d [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_);
    if (iVar1 != 0) {
      local_8d[0].first._M_string_length._1_4_ = 0;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
      ::pair<const_char_(&)[6],_FeeEstimateMode,_true>
                (in_stack_ffffffffffffff30,(char (*) [6])in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff20);
      local_8d[0].first._5_4_ = 1;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
      ::pair<const_char_(&)[11],_FeeEstimateMode,_true>
                (in_stack_ffffffffffffff30,(char (*) [11])in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff20);
      local_8d[0].first._M_dataplus._M_p._1_4_ = 2;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
      ::pair<const_char_(&)[13],_FeeEstimateMode,_true>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      ppVar4 = local_8d;
      std::
      allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>
      ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>
                   *)in_stack_fffffffffffffef8);
      __l._M_len = in_stack_ffffffffffffff48;
      __l._M_array = ppVar4;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
      ::vector(in_stack_ffffffffffffff38,__l,(allocator_type *)in_stack_ffffffffffffff30);
      std::
      allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>
      ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>
                    *)in_stack_fffffffffffffef8);
      plVar3 = (long *)((long)&local_8d[0].first._M_string_length + 5);
      plVar2 = &local_8;
      do {
        plVar2 = plVar2 + -5;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
        ::~pair(in_stack_fffffffffffffef8);
      } while (plVar2 != plVar3);
      __cxa_atexit(std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
                   ::~vector,&FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return &FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_;
  }
  __stack_chk_fail();
}

Assistant:

const std::vector<std::pair<std::string, FeeEstimateMode>>& FeeModeMap()
{
    static const std::vector<std::pair<std::string, FeeEstimateMode>> FEE_MODES = {
        {"unset", FeeEstimateMode::UNSET},
        {"economical", FeeEstimateMode::ECONOMICAL},
        {"conservative", FeeEstimateMode::CONSERVATIVE},
    };
    return FEE_MODES;
}